

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_ellswift_decode(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  bench_ellswift_data *data;
  size_t len;
  secp256k1_pubkey out;
  int i;
  undefined8 local_58;
  undefined1 local_50 [64];
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_10) {
      return;
    }
    iVar1 = secp256k1_ellswift_decode(*in_RDI,local_50,in_RDI + 0x801);
    if (iVar1 != 1) break;
    local_58 = 0x21;
    iVar1 = secp256k1_ec_pubkey_serialize
                      (*in_RDI,(long)in_RDI + (long)(local_10 % 0x20) + 0x4008,&local_58,local_50,
                       0x102);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ellswift/bench_impl.h"
              ,0x46,
              "test condition failed: secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED)"
             );
      abort();
    }
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ellswift/bench_impl.h"
          ,0x44,
          "test condition failed: secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1");
  abort();
}

Assistant:

static void bench_ellswift_decode(void *arg, int iters) {
    int i;
    secp256k1_pubkey out;
    size_t len;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        CHECK(secp256k1_ellswift_decode(data->ctx, &out, data->rnd64) == 1);
        len = 33;
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, data->rnd64 + (i % 32), &len, &out, SECP256K1_EC_COMPRESSED));
    }
}